

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O3

void __thiscall
ON_RandomNumberGenerator::RandomPermutation
          (ON_RandomNumberGenerator *this,void *base,size_t nel,size_t sizeof_element)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ON__UINT32 OVar4;
  undefined1 *puVar5;
  undefined8 *puVar6;
  undefined4 *puVar7;
  size_t sVar8;
  ulong uVar9;
  void *pvVar10;
  size_t sVar11;
  int iVar12;
  ON__UINT32 *a;
  
  if ((((sizeof_element != 0) && (base != (void *)0x0)) && (1 < nel)) &&
     ((sizeof_element | nel) >> 0x20 == 0)) {
    iVar12 = (int)nel;
    if ((sizeof_element & 7) == 0) {
      sVar11 = 0;
      pvVar10 = base;
      do {
        OVar4 = on_random_number(&this->m_rand_context);
        uVar9 = (ulong)OVar4 % (ulong)(uint)(iVar12 - (int)sVar11);
        if ((int)uVar9 != 0) {
          puVar6 = (undefined8 *)((long)base + uVar9 * 8 + sVar11 * 8);
          uVar9 = 0;
          do {
            uVar3 = *(undefined8 *)((long)pvVar10 + uVar9 * 8);
            *(undefined8 *)((long)pvVar10 + uVar9 * 8) = *puVar6;
            *puVar6 = uVar3;
            puVar6 = puVar6 + 1;
            uVar9 = uVar9 + 1;
          } while (sizeof_element >> 3 != uVar9);
        }
        sVar11 = sVar11 + 1;
        pvVar10 = (void *)((long)pvVar10 + 8);
      } while (sVar11 != nel);
    }
    else if ((sizeof_element & 3) == 0) {
      sVar11 = 0;
      pvVar10 = base;
      do {
        OVar4 = on_random_number(&this->m_rand_context);
        uVar9 = (ulong)OVar4 % (ulong)(uint)(iVar12 - (int)sVar11);
        if ((int)uVar9 != 0) {
          puVar7 = (undefined4 *)((long)base + uVar9 * 4 + sVar11 * 4);
          uVar9 = 0;
          do {
            uVar2 = *(undefined4 *)((long)pvVar10 + uVar9 * 4);
            *(undefined4 *)((long)pvVar10 + uVar9 * 4) = *puVar7;
            *puVar7 = uVar2;
            puVar7 = puVar7 + 1;
            uVar9 = uVar9 + 1;
          } while (sizeof_element >> 2 != uVar9);
        }
        sVar11 = sVar11 + 1;
        pvVar10 = (void *)((long)pvVar10 + 4);
      } while (sVar11 != nel);
    }
    else {
      sVar11 = 0;
      pvVar10 = base;
      do {
        OVar4 = on_random_number(&this->m_rand_context);
        uVar9 = (ulong)OVar4 % (ulong)(uint)(iVar12 - (int)sVar11);
        if ((int)uVar9 != 0) {
          puVar5 = (undefined1 *)((long)base + sVar11 + uVar9);
          sVar8 = 0;
          do {
            uVar1 = *(undefined1 *)((long)pvVar10 + sVar8);
            *(undefined1 *)((long)pvVar10 + sVar8) = *puVar5;
            *puVar5 = uVar1;
            puVar5 = puVar5 + 1;
            sVar8 = sVar8 + 1;
          } while (sizeof_element != sVar8);
        }
        sVar11 = sVar11 + 1;
        pvVar10 = (void *)((long)pvVar10 + 1);
      } while (sVar11 != nel);
    }
  }
  return;
}

Assistant:

void ON_RandomNumberGenerator::RandomPermutation(void* base, size_t nel, size_t sizeof_element )
{
  ON__UINT32 i, j, n;

  if ( 0 == base || nel <= 1 || sizeof_element <= 0 )
    return;

#if ON_SIZEOF_POINTER > 4
  if ( nel > 0xFFFFFFFF || sizeof_element > 0xFFFFFFFF)
    return;
#endif

  n = (ON__UINT32)nel; // for 64 bit systems, nel is wider than n.

  // References: 
  //  http://en.wikipedia.org/wiki/Random_permutation
  //  http://en.wikipedia.org/wiki/Knuth_shuffle

  // Note:
  //   There is the usual "sloppy bias" in the code below because 
  //   (on_random_number(&m_rand_context) % N) is used to get a random
  //   number int the range 0 to N-1 when N is not a factor of 2^32.
  //   As usual, this bias is not worth worrying about
  //   unlsess 2^32 / N is smallish.  If you need a random
  //   permutation of a very large array, look elsewhere.

  if ( 0 == sizeof_element % sizeof(ON__UINT64) )
  {
    ON__UINT64* a = (ON__UINT64*)base;
    sizeof_element /= sizeof(a[0]);
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap8(sizeof_element, a+i, a+i+j);
      }
    }
  }
  else if ( 0 == sizeof_element % sizeof(ON__UINT32) )
  {
    ON__UINT32* a = (ON__UINT32*)base;
    sizeof_element /= sizeof(a[0]);
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap4(sizeof_element, a+i, a+i+j);
      }
    }
  }
  else
  {
    unsigned char* a = (unsigned char*)base;
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap1(sizeof_element, a+i, a+i+j);
      }
    }
  }
}